

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStructCmpxchg
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          StructCmpxchg *curr)

{
  Type this_00;
  bool bVar1;
  byte bVar2;
  ExpressionRunner<wasm::ModuleRunner> *pEVar3;
  element_type *peVar4;
  Literal *pLVar5;
  Literal local_150;
  undefined1 local_138 [8];
  Literal oldVal;
  Literal *field;
  shared_ptr<wasm::GCData> data;
  Flow replacement;
  Flow expected;
  undefined1 local_68 [8];
  Flow ref;
  StructCmpxchg *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  ref.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  visit((Flow *)local_68,pEVar3,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x18));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    visit((Flow *)&replacement.breakTo.super_IString.str._M_str,pEVar3,
          *(Expression **)(ref.breakTo.super_IString.str._M_str + 0x20));
    bVar1 = Flow::breaking((Flow *)&replacement.breakTo.super_IString.str._M_str);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&replacement.breakTo.super_IString.str._M_str);
    }
    else {
      pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      visit((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
            pEVar3,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x28));
      bVar1 = Flow::breaking((Flow *)&data.
                                      super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount);
      if (bVar1) {
        Flow::Flow(__return_storage_ptr__,
                   (Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
      }
      else {
        Flow::getSingleValue((Flow *)local_68);
        ::wasm::Literal::getGCData();
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&field);
        if (!bVar1) {
          (*this->_vptr_ExpressionRunner[2])(this,"null ref");
        }
        peVar4 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&field);
        oldVal.type.id =
             (uintptr_t)
             SmallVector<wasm::Literal,_1UL>::operator[]
                       (&(peVar4->values).super_SmallVector<wasm::Literal,_1UL>,
                        (ulong)*(uint *)(ref.breakTo.super_IString.str._M_str + 0x10));
        ::wasm::Literal::Literal((Literal *)local_138,(Literal *)oldVal.type.id);
        this_00.id = oldVal.type.id;
        pLVar5 = Flow::getSingleValue((Flow *)&replacement.breakTo.super_IString.str._M_str);
        bVar2 = ::wasm::Literal::operator==((Literal *)this_00.id,pLVar5);
        if ((bVar2 & 1) != 0) {
          pLVar5 = Flow::getSingleValue
                             ((Flow *)&data.
                                       super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount);
          ::wasm::Literal::operator=((Literal *)oldVal.type.id,pLVar5);
        }
        ::wasm::Literal::Literal(&local_150,(Literal *)local_138);
        Flow::Flow(__return_storage_ptr__,&local_150);
        ::wasm::Literal::~Literal(&local_150);
        ::wasm::Literal::~Literal((Literal *)local_138);
        std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&field);
      }
      Flow::~Flow((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    }
    Flow::~Flow((Flow *)&replacement.breakTo.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStructCmpxchg(StructCmpxchg* curr) {
    NOTE_ENTER("StructCmpxchg");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow expected = self()->visit(curr->expected);
    if (expected.breaking()) {
      return expected;
    }
    Flow replacement = self()->visit(curr->replacement);
    if (replacement.breaking()) {
      return replacement;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    auto& field = data->values[curr->index];
    auto oldVal = field;
    if (field == expected.getSingleValue()) {
      field = replacement.getSingleValue();
    }
    return oldVal;
  }